

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

string * bloaty::(anonymous_namespace)::PercentString_abi_cxx11_(double percent,bool diff_mode)

{
  uint uVar1;
  byte in_SIL;
  string *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  char *__rhs;
  int digits;
  string str;
  double in_stack_000002d0;
  char *in_stack_000002d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [36];
  int local_4c;
  string local_48 [34];
  allocator<char> local_26;
  allocator<char> local_25 [19];
  allocator<char> local_12;
  byte local_11;
  double local_10;
  
  local_11 = in_SIL & 1;
  if (local_11 == 0) {
    DoubleStringPrintf_abi_cxx11_(in_stack_000002d8,in_stack_000002d0);
  }
  else if (((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) ||
          (local_10 = in_XMM0_Qa, uVar1 = std::isnan(in_XMM0_Qa), (uVar1 & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (allocator<char> *)in_stack_fffffffffffffed0);
    std::allocator<char>::~allocator(&local_12);
  }
  else if ((local_10 != -100.0) || (NAN(local_10))) {
    uVar1 = std::isinf(local_10);
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::string(local_48);
      if (local_10 <= 1000.0) {
        if (local_10 <= 10.0) {
          DoubleStringPrintf_abi_cxx11_(in_stack_000002d8,in_stack_000002d0);
          std::__cxx11::string::operator=(local_48,(string *)&stack0xfffffffffffffed0);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
        }
        else {
          DoubleStringPrintf_abi_cxx11_(in_stack_000002d8,in_stack_000002d0);
          std::__cxx11::string::operator=(local_48,local_110);
          std::__cxx11::string::~string(local_110);
        }
      }
      else {
        dVar2 = log10(local_10);
        local_4c = (int)(dVar2 + -1.0);
        __rhs = (char *)std::pow<int,int>(0,0x18f6f8);
        DoubleStringPrintf_abi_cxx11_(in_stack_000002d8,in_stack_000002d0);
        std::operator+(in_stack_fffffffffffffea8,__rhs);
        std::__cxx11::to_string(in_stack_fffffffffffffeec);
        std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        std::operator+(in_stack_fffffffffffffea8,__rhs);
        std::__cxx11::string::operator=(local_48,local_70);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_f0);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_d0);
      }
      anon_unknown_33::LeftPad
                ((string *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (size_t)in_stack_fffffffffffffee0);
      std::__cxx11::string::~string(local_48);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                 (allocator<char> *)in_stack_fffffffffffffed0);
      std::allocator<char>::~allocator(&local_26);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (allocator<char> *)in_stack_fffffffffffffed0);
    std::allocator<char>::~allocator(local_25);
  }
  return in_RDI;
}

Assistant:

std::string PercentString(double percent, bool diff_mode) {
  if (diff_mode) {
    if (percent == 0 || std::isnan(percent)) {
      return " [ = ]";
    } else if (percent == -100) {
      return " [DEL]";
    } else if (std::isinf(percent)) {
      return " [NEW]";
    } else {
      // We want to keep this fixed-width even if the percent is very large.
      std::string str;
      if (percent > 1000) {
        int digits = log10(percent) - 1;
        str = DoubleStringPrintf("%+2.0f", percent / pow(10, digits)) + "e" +
              std::to_string(digits) + "%";
      } else if (percent > 10) {
        str = DoubleStringPrintf("%+4.0f%%", percent);
      } else {
        str = DoubleStringPrintf("%+5.1F%%", percent);
      }

      return LeftPad(str, 6);
    }
  } else {
    return DoubleStringPrintf("%5.1F%%", percent);
  }
}